

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O0

EncoderOptions * __thiscall draco::Encoder::CreateExpertEncoderOptions(Encoder *this,PointCloud *pc)

{
  int32_t iVar1;
  Type TVar2;
  EncoderOptionsBase<draco::GeometryAttribute::Type> *pEVar3;
  PointAttribute *this_00;
  EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *in_RSI;
  EncoderOptions *in_RDI;
  Options *att_options;
  int i;
  EncoderOptions *ret_options;
  undefined4 in_stack_ffffffffffffff58;
  int32_t in_stack_ffffffffffffff5c;
  PointCloud *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 local_30;
  
  EncoderOptionsBase<int>::CreateEmptyOptions();
  pEVar3 = EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::options(in_RSI);
  DracoOptions<draco::GeometryAttribute::Type>::GetGlobalOptions
            (&pEVar3->super_DracoOptions<draco::GeometryAttribute::Type>);
  DracoOptions<int>::SetGlobalOptions
            ((DracoOptions<int> *)in_stack_ffffffffffffff60,
             (Options *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  pEVar3 = EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::options(in_RSI);
  EncoderOptionsBase<draco::GeometryAttribute::Type>::GetFeaturelOptions(pEVar3);
  EncoderOptionsBase<int>::SetFeatureOptions
            ((EncoderOptionsBase<int> *)in_stack_ffffffffffffff60,
             (Options *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  for (local_30 = 0; iVar1 = PointCloud::num_attributes((PointCloud *)0x156349), local_30 < iVar1;
      local_30 = local_30 + 1) {
    pEVar3 = EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::options
                       (in_RSI);
    this_00 = PointCloud::attribute(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    TVar2 = GeometryAttribute::attribute_type(&this_00->super_GeometryAttribute);
    in_stack_ffffffffffffff60 =
         (PointCloud *)
         DracoOptions<draco::GeometryAttribute::Type>::FindAttributeOptions
                   (&pEVar3->super_DracoOptions<draco::GeometryAttribute::Type>,(Type *)this_00);
    if (in_stack_ffffffffffffff60 != (PointCloud *)0x0) {
      DracoOptions<int>::SetAttributeOptions
                ((DracoOptions<int> *)this_00,
                 (AttributeKey *)CONCAT44(TVar2,in_stack_ffffffffffffff68),
                 (Options *)in_stack_ffffffffffffff60);
    }
  }
  return in_RDI;
}

Assistant:

EncoderOptions Encoder::CreateExpertEncoderOptions(const PointCloud &pc) const {
  EncoderOptions ret_options = EncoderOptions::CreateEmptyOptions();
  ret_options.SetGlobalOptions(options().GetGlobalOptions());
  ret_options.SetFeatureOptions(options().GetFeaturelOptions());
  // Convert type-based attribute options to specific attributes in the provided
  // point cloud.
  for (int i = 0; i < pc.num_attributes(); ++i) {
    const Options *att_options =
        options().FindAttributeOptions(pc.attribute(i)->attribute_type());
    if (att_options) {
      ret_options.SetAttributeOptions(i, *att_options);
    }
  }
  return ret_options;
}